

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O3

void __thiscall Lodtalk::AST::MethodHeader::~MethodHeader(MethodHeader *this)

{
  ~MethodHeader(this);
  operator_delete(this);
  return;
}

Assistant:

MethodHeader::~MethodHeader()
{
	delete arguments;
}